

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

int Abc_NtkAppend(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fAddPos)

{
  Abc_Aig_t *pMan;
  Nm_Man_t *p;
  int iVar1;
  int i;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  
  if (pNtk1->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x146,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    iVar1 = Abc_NtkToAig(pNtk2);
    if (iVar1 == 0) {
      pcVar4 = "Converting to AIGs has failed.";
      goto LAB_002b9f02;
    }
  }
  else if (pNtk2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x147,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkCompareSignals(pNtk1,pNtk2,1,1);
  if (iVar1 == 0) {
    puts("Abc_NtkAppend(): The union of the network PIs is computed (warning).");
  }
  Abc_NtkCleanCopy(pNtk2);
  if (pNtk2->ntkType == ABC_NTK_STRASH) {
    pAVar2 = Abc_AigConst1(pNtk1);
    pAVar3 = Abc_AigConst1(pNtk2);
    (pAVar3->field_6).pCopy = pAVar2;
  }
  uVar6 = 0;
  for (iVar1 = 0; iVar1 < pNtk2->vCis->nSize; iVar1 = iVar1 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pNtk2->vCis,iVar1);
    Abc_ObjName(pAVar2);
    pcVar4 = Abc_ObjName(pAVar2);
    pAVar3 = Abc_NtkFindCi(pNtk1,pcVar4);
    (pAVar2->field_6).pCopy = pAVar3;
    if (pAVar3 == (Abc_Obj_t *)0x0) {
      pAVar3 = Abc_NtkDupObj(pNtk1,pAVar2,1);
      (pAVar2->field_6).pCopy = pAVar3;
      uVar6 = uVar6 + 1;
    }
  }
  if (uVar6 != 0) {
    printf("Warning: Procedure Abc_NtkAppend() added %d new CIs.\n",(ulong)uVar6);
  }
  if (pNtk2->ntkType == ABC_NTK_LOGIC) {
    Abc_NtkStrashPerform(pNtk2,pNtk1,1,0);
  }
  else {
    for (iVar1 = 0; iVar1 < pNtk2->vObjs->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = Abc_NtkObj(pNtk2,iVar1);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        pMan = (Abc_Aig_t *)pNtk1->pManFunc;
        pAVar3 = Abc_ObjChild0Copy(pAVar2);
        pAVar5 = Abc_ObjChild1Copy(pAVar2);
        pAVar3 = Abc_AigAnd(pMan,pAVar3,pAVar5);
        (pAVar2->field_6).pCopy = pAVar3;
      }
    }
  }
  if (fAddPos == 0) {
    for (iVar1 = 0; iVar1 < pNtk2->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = Abc_NtkCo(pNtk2,iVar1);
      p = pNtk1->pManName;
      pcVar4 = Abc_ObjName(pAVar2);
      i = Nm_ManFindIdByNameTwoTypes(p,pcVar4,3,4);
      if (i < 0) {
        __assert_fail("iNodeId >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                      ,0x17c,"int Abc_NtkAppend(Abc_Ntk_t *, Abc_Ntk_t *, int)");
      }
      pAVar3 = Abc_NtkObj(pNtk1,i);
      pAVar5 = Abc_ObjChild0(pAVar3);
      pAVar2 = Abc_ObjChild0Copy(pAVar2);
      pAVar2 = Abc_AigOr((Abc_Aig_t *)pNtk1->pManFunc,pAVar5,pAVar2);
      pAVar5 = (Abc_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe);
      pAVar2 = (Abc_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
      if (pAVar5 != pAVar2) {
        Abc_ObjPatchFanin(pAVar3,pAVar5,
                          (Abc_Obj_t *)
                          ((ulong)((*(uint *)&pAVar2->field_0x14 ^ *(uint *)&pAVar5->field_0x14) >>
                                   7 & 1) | (ulong)pAVar2));
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < pNtk2->vPos->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkPo(pNtk2,iVar1);
      Abc_NtkDupObj(pNtk1,pAVar3,0);
      pAVar2 = (pAVar3->field_6).pCopy;
      pAVar5 = Abc_ObjChild0Copy(pAVar3);
      Abc_ObjAddFanin(pAVar2,pAVar5);
      pAVar2 = (pAVar3->field_6).pCopy;
      pcVar4 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
    }
  }
  iVar1 = Abc_NtkCheck(pNtk1);
  if (iVar1 != 0) {
    return 1;
  }
  pcVar4 = "Abc_NtkAppend: The network check has failed.";
LAB_002b9f02:
  puts(pcVar4);
  return 0;
}

Assistant:

int Abc_NtkAppend( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fAddPos )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i, nNewCis;
    // the first network should be an AIG
    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsLogic(pNtk2) || Abc_NtkIsStrash(pNtk2) ); 
    if ( Abc_NtkIsLogic(pNtk2) && !Abc_NtkToAig(pNtk2) )
    {
        printf( "Converting to AIGs has failed.\n" );
        return 0;
    }
    // check that the networks have the same PIs
    // reorder PIs of pNtk2 according to pNtk1
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, 1, 1 ) )
        printf( "Abc_NtkAppend(): The union of the network PIs is computed (warning).\n" );
    // perform strashing
    nNewCis = 0;
    Abc_NtkCleanCopy( pNtk2 );
    if ( Abc_NtkIsStrash(pNtk2) )
        Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtk1);
    Abc_NtkForEachCi( pNtk2, pObj, i )
    {
        pName = Abc_ObjName(pObj);
        pObj->pCopy = Abc_NtkFindCi(pNtk1, Abc_ObjName(pObj));
        if ( pObj->pCopy == NULL )
        {
            pObj->pCopy = Abc_NtkDupObj(pNtk1, pObj, 1);
            nNewCis++;
        }
    }
    if ( nNewCis )
        printf( "Warning: Procedure Abc_NtkAppend() added %d new CIs.\n", nNewCis );
    // add pNtk2 to pNtk1 while strashing
    if ( Abc_NtkIsLogic(pNtk2) )
        Abc_NtkStrashPerform( pNtk2, pNtk1, 1, 0 );
    else
        Abc_NtkForEachNode( pNtk2, pObj, i )
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk1->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the COs of the second network
    if ( fAddPos )
    {
        Abc_NtkForEachPo( pNtk2, pObj, i )
        {
            Abc_NtkDupObj( pNtk1, pObj, 0 );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
    }
    else
    {
        Abc_Obj_t * pObjOld, * pDriverOld, * pDriverNew;
        int fCompl, iNodeId;
        // OR the choices
        Abc_NtkForEachCo( pNtk2, pObj, i )
        {
            iNodeId = Nm_ManFindIdByNameTwoTypes( pNtk1->pManName, Abc_ObjName(pObj), ABC_OBJ_PO, ABC_OBJ_BI );
//            if ( iNodeId < 0 )
//                continue;
            assert( iNodeId >= 0 );
            pObjOld = Abc_NtkObj( pNtk1, iNodeId );
            // derive the new driver
            pDriverOld = Abc_ObjChild0( pObjOld );
            pDriverNew = Abc_ObjChild0Copy( pObj );
            pDriverNew = Abc_AigOr( (Abc_Aig_t *)pNtk1->pManFunc, pDriverOld, pDriverNew );
            if ( Abc_ObjRegular(pDriverOld) == Abc_ObjRegular(pDriverNew) )
                continue;
            // replace the old driver by the new driver
            fCompl = Abc_ObjRegular(pDriverOld)->fPhase ^ Abc_ObjRegular(pDriverNew)->fPhase;
            Abc_ObjPatchFanin( pObjOld, Abc_ObjRegular(pDriverOld), Abc_ObjNotCond(Abc_ObjRegular(pDriverNew), fCompl) );
        }
    }
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk1 ) )
    {
        printf( "Abc_NtkAppend: The network check has failed.\n" );
        return 0;
    }
    return 1;
}